

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrint.cpp
# Opt level: O3

int main(int argC,char **argV)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  XercesDOMParser *this;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  DOMPrintFilter *this_00;
  long *plVar10;
  long *plVar11;
  undefined8 uVar12;
  long *plVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  char *pcVar17;
  undefined8 *puVar18;
  bool bVar19;
  ulong uVar20;
  ulong uVar21;
  char *pcVar22;
  XMLCh tempStr [3];
  XMLCh *xpathStr;
  LocalFileFormatTarget *local_1060;
  wchar16 local_1040 [4];
  wchar16 *local_1038 [513];
  
  pcVar17 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    uVar20 = 1;
    do {
      pcVar22 = argV[uVar20];
      uVar21 = uVar20;
      if (*pcVar22 != '-') break;
      if ((pcVar22[1] == '?') && (pcVar22[2] == '\0')) {
        usage();
        goto LAB_00103e99;
      }
      if (((pcVar22[1] == 'v') && (pcVar22[2] == '=')) ||
         ((pcVar22[1] == 'V' && (pcVar22[2] == '=')))) {
        pcVar22 = pcVar22 + 3;
        pcVar17 = "never";
        iVar5 = strcmp(pcVar22,"never");
        if (iVar5 == 0) {
          gValScheme = Val_Never;
          bVar1 = gDiscardDefaultContent;
          bVar2 = gSplitCdataSections;
          bVar3 = gXMLDeclaration;
        }
        else {
          pcVar17 = "auto";
          iVar5 = strcmp(pcVar22,"auto");
          if (iVar5 == 0) {
            gValScheme = Val_Auto;
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
          else {
            pcVar17 = "always";
            iVar5 = strcmp(pcVar22,"always");
            if (iVar5 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Unknown -v= value: ",0x13);
              sVar15 = strlen(pcVar22);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,pcVar22,sVar15);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
              std::ostream::put(-0x40);
              std::ostream::flush();
              goto LAB_00103e99;
            }
            gValScheme = Val_Always;
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
        }
      }
      else {
        bVar1 = gDiscardDefaultContent;
        bVar2 = gSplitCdataSections;
        bVar3 = gXMLDeclaration;
        if (((pcVar22[1] == 'n') && (pcVar22[2] == '\0')) ||
           ((pcVar22[1] == 'N' && (pcVar22[2] == '\0')))) {
          gDoNamespaces = 1;
        }
        else if (((pcVar22[1] == 's') && (pcVar22[2] == '\0')) ||
                ((pcVar22[1] == 'S' && (pcVar22[2] == '\0')))) {
          gDoSchema = 1;
        }
        else if (((pcVar22[1] == 'f') && (pcVar22[2] == '\0')) ||
                ((pcVar22[1] == 'F' && (pcVar22[2] == '\0')))) {
          gSchemaFullChecking = 1;
        }
        else if (((pcVar22[1] == 'e') && (pcVar22[2] == '\0')) ||
                ((pcVar22[1] == 'E' && (pcVar22[2] == '\0')))) {
          gDoCreate = (XercesDOMParser)0x1;
        }
        else {
          iVar5 = strncmp(pcVar22,"-wenc=",6);
          if (iVar5 == 0) {
            pcVar17 = (char *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            gOutputEncoding =
                 (XMLCh *)xercesc_4_0::XMLString::transcode
                                    (pcVar22 + 6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
          else {
            pcVar17 = "-wfile=";
            iVar5 = strncmp(pcVar22,"-wfile=",7);
            if (iVar5 == 0) {
              goutputfile = pcVar22 + 7;
              bVar1 = gDiscardDefaultContent;
              bVar2 = gSplitCdataSections;
              bVar3 = gXMLDeclaration;
            }
            else {
              pcVar17 = "-wddc=";
              iVar5 = strncmp(pcVar22,"-wddc=",6);
              if (iVar5 == 0) {
                if (((pcVar22[6] == 'o') && (pcVar22[7] == 'n')) && (pcVar22[8] == '\0')) {
                  bVar1 = 0;
                  bVar2 = gSplitCdataSections;
                  bVar3 = gXMLDeclaration;
                }
                else {
                  pcVar17 = "off";
                  iVar5 = strcmp(pcVar22 + 6,"off");
                  bVar1 = 1;
                  bVar2 = gSplitCdataSections;
                  bVar3 = gXMLDeclaration;
                  if (iVar5 != 0) {
                    pcVar17 = "Unknown -wddc= value: ";
LAB_00103f1a:
                    pcVar22 = pcVar22 + 6;
                    lVar14 = 0x16;
LAB_00103f1f:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar17,lVar14);
                    sVar15 = strlen(pcVar22);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pcVar22,sVar15);
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00103e99:
                    xercesc_4_0::XMLPlatformUtils::Terminate();
                    return 2;
                  }
                }
              }
              else {
                pcVar17 = "-wscs=";
                iVar5 = strncmp(pcVar22,"-wscs=",6);
                if (iVar5 == 0) {
                  if (((pcVar22[6] == 'o') && (pcVar22[7] == 'n')) && (pcVar22[8] == '\0')) {
                    bVar1 = gDiscardDefaultContent;
                    bVar2 = 0;
                    bVar3 = gXMLDeclaration;
                  }
                  else {
                    pcVar17 = "off";
                    iVar5 = strcmp(pcVar22 + 6,"off");
                    bVar1 = gDiscardDefaultContent;
                    bVar2 = 1;
                    bVar3 = gXMLDeclaration;
                    if (iVar5 != 0) {
                      pcVar17 = "Unknown -wscs= value: ";
                      goto LAB_00103f1a;
                    }
                  }
                }
                else {
                  pcVar17 = "-wflt=";
                  iVar5 = strncmp(pcVar22,"-wflt=",6);
                  if (iVar5 == 0) {
                    if (((pcVar22[6] == 'o') && (pcVar22[7] == 'n')) && (pcVar22[8] == '\0')) {
                      gUseFilter = 1;
                      bVar1 = gDiscardDefaultContent;
                      bVar2 = gSplitCdataSections;
                      bVar3 = gXMLDeclaration;
                    }
                    else {
                      pcVar17 = "off";
                      iVar5 = strcmp(pcVar22 + 6,"off");
                      if (iVar5 != 0) {
                        pcVar17 = "Unknown -wflt= value: ";
                        goto LAB_00103f1a;
                      }
                      gUseFilter = 0;
                      bVar1 = gDiscardDefaultContent;
                      bVar2 = gSplitCdataSections;
                      bVar3 = gXMLDeclaration;
                    }
                  }
                  else {
                    pcVar17 = "-wfpp=";
                    iVar5 = strncmp(pcVar22,"-wfpp=",6);
                    if (iVar5 == 0) {
                      if (((pcVar22[6] == 'o') && (pcVar22[7] == 'n')) && (pcVar22[8] == '\0')) {
                        gFormatPrettyPrint = 1;
                        bVar1 = gDiscardDefaultContent;
                        bVar2 = gSplitCdataSections;
                        bVar3 = gXMLDeclaration;
                      }
                      else {
                        pcVar17 = "off";
                        iVar5 = strcmp(pcVar22 + 6,"off");
                        if (iVar5 != 0) {
                          pcVar17 = "Unknown -wfpp= value: ";
                          goto LAB_00103f1a;
                        }
                        gFormatPrettyPrint = 0;
                        bVar1 = gDiscardDefaultContent;
                        bVar2 = gSplitCdataSections;
                        bVar3 = gXMLDeclaration;
                      }
                    }
                    else {
                      pcVar17 = "-wfdecl=";
                      iVar5 = strncmp(pcVar22,"-wfdecl=",8);
                      if (iVar5 == 0) {
                        if (((pcVar22[8] == 'o') && (pcVar22[9] == 'n')) && (pcVar22[10] == '\0')) {
                          bVar1 = gDiscardDefaultContent;
                          bVar2 = gSplitCdataSections;
                          bVar3 = 0;
                        }
                        else {
                          pcVar22 = pcVar22 + 8;
                          pcVar17 = "off";
                          iVar5 = strcmp(pcVar22,"off");
                          bVar1 = gDiscardDefaultContent;
                          bVar2 = gSplitCdataSections;
                          bVar3 = 1;
                          if (iVar5 != 0) {
                            pcVar17 = "Unknown -wfdecl= value: ";
                            lVar14 = 0x18;
                            goto LAB_00103f1f;
                          }
                        }
                      }
                      else {
                        pcVar17 = "-wbom=";
                        iVar5 = strncmp(pcVar22,"-wbom=",6);
                        if (iVar5 == 0) {
                          if (((pcVar22[6] == 'o') && (pcVar22[7] == 'n')) && (pcVar22[8] == '\0'))
                          {
                            gWriteBOM = 1;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                          else {
                            pcVar17 = "off";
                            iVar5 = strcmp(pcVar22 + 6,"off");
                            if (iVar5 != 0) {
                              pcVar17 = "Unknown -wbom= value: ";
                              goto LAB_00103f1a;
                            }
                            gWriteBOM = 0;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                        }
                        else {
                          pcVar17 = "-xpath=";
                          iVar5 = strncmp(pcVar22,"-xpath=",7);
                          if (iVar5 == 0) {
                            gXPathExpression = pcVar22 + 7;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cerr,"Unknown option \'",0x10);
                            poVar6 = std::operator<<((ostream *)&std::cerr,argV[uVar20]);
                            pcVar17 = "\', ignoring it.\n";
                            std::__ostream_insert<char,std::char_traits<char>>
                                      (poVar6,"\', ignoring it.\n",0x10);
                            std::endl<char,std::char_traits<char>>(poVar6);
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      gXMLDeclaration = bVar3;
      gSplitCdataSections = bVar2;
      gDiscardDefaultContent = bVar1;
      uVar20 = uVar20 + 1;
      uVar21 = (ulong)(uint)argC;
    } while ((uint)argC != uVar20);
    if ((int)uVar21 + 1 == argC) {
      this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar17);
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
      bVar19 = SUB81(this,0);
      xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar19);
      xercesc_4_0::AbstractDOMParser::setDoSchema(bVar19);
      xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar19);
      xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar19);
      this[0x28] = gDoCreate;
      plVar7 = (long *)operator_new(0x10);
      *plVar7 = (long)&PTR__ErrorHandler_00107cf8;
      *(undefined1 *)(plVar7 + 1) = 0;
      xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
      xercesc_4_0::AbstractDOMParser::parse((char *)this);
      iVar5 = 4;
      if ((char)plVar7[1] == '\0') {
        local_1040[2] = 0;
        local_1040[0] = L'L';
        local_1040[1] = L'S';
        plVar8 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(local_1040);
        plVar9 = (long *)(**(code **)(*plVar8 + 0x18))
                                   (plVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar8 = (long *)(**(code **)(*plVar8 + 0x28))
                                   (plVar8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        (**(code **)(*plVar8 + 0x30))(plVar8,gOutputEncoding);
        if (gUseFilter == 1) {
          this_00 = (DOMPrintFilter *)operator_new(0x10);
          DOMPrintFilter::DOMPrintFilter(this_00,0x203);
          (**(code **)(*plVar9 + 0x20))(plVar9,this_00);
        }
        else {
          this_00 = (DOMPrintFilter *)0x0;
        }
        plVar10 = (long *)operator_new(8);
        *plVar10 = (long)&PTR__DOMErrorHandler_00107c38;
        plVar11 = (long *)(**(code **)(*plVar9 + 0x10))(plVar9);
        (**(code **)*plVar11)(plVar11,&xercesc_4_0::XMLUni::fgDOMErrorHandler,plVar10);
        cVar4 = (**(code **)(*plVar11 + 0x20))
                          (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                           gSplitCdataSections ^ 1);
        if (cVar4 != '\0') {
          (**(code **)(*plVar11 + 8))
                    (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                     gSplitCdataSections ^ 1);
        }
        cVar4 = (**(code **)(*plVar11 + 0x20))
                          (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                           gDiscardDefaultContent ^ 1);
        if (cVar4 != '\0') {
          (**(code **)(*plVar11 + 8))
                    (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                     gDiscardDefaultContent ^ 1);
        }
        cVar4 = (**(code **)(*plVar11 + 0x20))
                          (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,
                           gFormatPrettyPrint);
        if (cVar4 != '\0') {
          (**(code **)(*plVar11 + 8))
                    (plVar11,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,gFormatPrettyPrint);
        }
        cVar4 = (**(code **)(*plVar11 + 0x20))(plVar11,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        if (cVar4 != '\0') {
          (**(code **)(*plVar11 + 8))(plVar11,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        }
        puVar18 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
        cVar4 = (**(code **)(*plVar11 + 0x20))
                          (plVar11,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        if (cVar4 != '\0') {
          puVar18 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
          (**(code **)(*plVar11 + 8))
                    (plVar11,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        }
        if (goutputfile == (char *)0x0) {
          local_1060 = (LocalFileFormatTarget *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x8,(ulong)puVar18);
          xercesc_4_0::StdOutFormatTarget::StdOutFormatTarget((StdOutFormatTarget *)local_1060);
        }
        else {
          local_1060 = (LocalFileFormatTarget *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)puVar18);
          xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                    (local_1060,goutputfile,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        }
        (**(code **)(*plVar8 + 0x28))(plVar8,local_1060);
        plVar11 = (long *)xercesc_4_0::AbstractDOMParser::getDocument();
        if (gXPathExpression == (char *)0x0) {
          plVar13 = plVar11 + 3;
          if (plVar11 == (long *)0x0) {
            plVar13 = (long *)0x0;
          }
          (**(code **)(*plVar9 + 0x38))(plVar9,plVar13,plVar8);
        }
        else {
          local_1038[0] =
               (wchar16 *)
               xercesc_4_0::XMLString::transcode
                         (gXPathExpression,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          uVar12 = (**(code **)(*plVar11 + 0x68))(plVar11);
          plVar13 = plVar11 + 1;
          plVar11 = (long *)(**(code **)(plVar11[1] + 0x18))(plVar13,uVar12);
          plVar13 = (long *)(**(code **)(*plVar13 + 0x20))(plVar13,local_1038[0],uVar12,plVar11,7,0)
          ;
          lVar14 = (**(code **)(*plVar13 + 0x68))(plVar13);
          if (lVar14 != 0) {
            lVar16 = 0;
            do {
              (**(code **)(*plVar13 + 0x60))(plVar13,lVar16);
              uVar12 = (**(code **)(*plVar13 + 0x48))(plVar13);
              (**(code **)(*plVar9 + 0x38))(plVar9,uVar12,plVar8);
              lVar16 = lVar16 + 1;
            } while (lVar14 != lVar16);
          }
          (**(code **)(*plVar13 + 0x70))(plVar13);
          (**(code **)(*plVar11 + 0x28))(plVar11);
          xercesc_4_0::XMLString::release(local_1038,xercesc_4_0::XMLPlatformUtils::fgMemoryManager)
          ;
        }
        iVar5 = 0;
        (**(code **)(*plVar8 + 0x40))(plVar8);
        (**(code **)(*plVar9 + 0x50))(plVar9);
        (**(code **)(*(long *)local_1060 + 8))();
        (**(code **)(*plVar10 + 8))();
        if ((this_00 != (DOMPrintFilter *)0x0) && ((gUseFilter & 1) != 0)) {
          (*(this_00->super_DOMLSSerializerFilter).super_DOMNodeFilter._vptr_DOMNodeFilter[1])();
        }
      }
      (**(code **)(*plVar7 + 8))();
      (**(code **)(*(long *)this + 8))(this);
      xercesc_4_0::XMLString::release
                (&gOutputEncoding,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return iVar5;
    }
  }
  usage();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    int retval = 0;

    // Initialize the XML4C2 system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException &toCatch)
    {
        std::cerr << "Error during Xerces-c Initialization.\n"
             << "  Exception message:"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                gValScheme = XercesDOMParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                gValScheme = XercesDOMParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                gValScheme = XercesDOMParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else if (!strcmp(argV[parmInd], "-e")
              ||  !strcmp(argV[parmInd], "-E"))
        {
            gDoCreate = true;
        }
         else if (!strncmp(argV[parmInd], "-wenc=", 6))
        {
             // Get out the encoding name
             gOutputEncoding = XMLString::transcode( &(argV[parmInd][6]) );
        }
         else if (!strncmp(argV[parmInd], "-wfile=", 7))
        {
             goutputfile =  &(argV[parmInd][7]);
        }
         else if (!strncmp(argV[parmInd], "-wddc=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gDiscardDefaultContent = true;
            else if (!strcmp(parm, "off"))
				gDiscardDefaultContent = false;
            else
            {
                std::cerr << "Unknown -wddc= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }

        }
         else if (!strncmp(argV[parmInd], "-wscs=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gSplitCdataSections = true;
			else if (!strcmp(parm, "off"))
				gSplitCdataSections = false;
            else
            {
                std::cerr << "Unknown -wscs= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wflt=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gUseFilter = true;
			else if (!strcmp(parm, "off"))
				gUseFilter = false;
            else
            {
                std::cerr << "Unknown -wflt= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfpp=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gFormatPrettyPrint = true;
			else if (!strcmp(parm, "off"))
				gFormatPrettyPrint = false;
            else
            {
                std::cerr << "Unknown -wfpp= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfdecl=", 8))
        {
             const char* const parm = &argV[parmInd][8];

             if (!strcmp(parm, "on"))
                 gXMLDeclaration = true;
             else if (!strcmp(parm, "off"))
                 gXMLDeclaration = false;
             else
             {
                 std::cerr << "Unknown -wfdecl= value: " << parm << std::endl;
                 XMLPlatformUtils::Terminate();
                 return 2;
             }
        }
         else if (!strncmp(argV[parmInd], "-wbom=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
                gWriteBOM = true;
            else if (!strcmp(parm, "off"))
                gWriteBOM = false;
            else
            {
                std::cerr << "Unknown -wbom= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-xpath=", 7))
        {
             gXPathExpression = &(argV[parmInd][7]);
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }
    gXmlFile = argV[parmInd];

    //
    //  Create our parser, then attach an error handler to the parser.
    //  The parser will call back to methods of the ErrorHandler if it
    //  discovers errors during the course of parsing the XML document.
    //
    XercesDOMParser *parser = new XercesDOMParser;
    parser->setValidationScheme(gValScheme);
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    parser->setCreateEntityReferenceNodes(gDoCreate);

    DOMTreeErrorReporter *errReporter = new DOMTreeErrorReporter();
    parser->setErrorHandler(errReporter);

    //
    //  Parse the XML file, catching any XML exceptions that might propogate
    //  out of it.
    //
    bool errorsOccured = false;
    try
    {
        parser->parse(gXmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorsOccured = true;
    }
    catch (const XMLException& e)
    {
        std::cerr << "An error occurred during parsing\n   Message: "
             << StrX(e.getMessage()) << std::endl;
        errorsOccured = true;
    }

    catch (const DOMException& e)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << gXmlFile << "'\n"
             << "DOMException code is:  " << e.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(e.code, errText, maxChars))
             std::cerr << "Message is: " << StrX(errText) << std::endl;

        errorsOccured = true;
    }

    catch (...)
    {
        std::cerr << "An error occurred during parsing\n " << std::endl;
        errorsOccured = true;
    }

    // If the parse was successful, output the document data from the DOM tree
    if (!errorsOccured && !errReporter->getSawErrors())
    {
        DOMPrintFilter   *myFilter = 0;

        try
        {
            // get a serializer, an instance of DOMLSSerializer
            XMLCh tempStr[3] = {chLatin_L, chLatin_S, chNull};
            DOMImplementation *impl          = DOMImplementationRegistry::getDOMImplementation(tempStr);
            DOMLSSerializer   *theSerializer = ((DOMImplementationLS*)impl)->createLSSerializer();
            DOMLSOutput       *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

            // set user specified output encoding
            theOutputDesc->setEncoding(gOutputEncoding);

            // plug in user's own filter
            if (gUseFilter)
            {
                // even we say to show attribute, but the DOMLSSerializer
                // will not show attribute nodes to the filter as
                // the specs explicitly says that DOMLSSerializer shall
                // NOT show attributes to DOMLSSerializerFilter.
                //
                // so DOMNodeFilter::SHOW_ATTRIBUTE has no effect.
                // same DOMNodeFilter::SHOW_DOCUMENT_TYPE, no effect.
                //
                myFilter = new DOMPrintFilter(DOMNodeFilter::SHOW_ELEMENT   |
                                              DOMNodeFilter::SHOW_ATTRIBUTE |
                                              DOMNodeFilter::SHOW_DOCUMENT_TYPE);
                theSerializer->setFilter(myFilter);
            }

            // plug in user's own error handler
            DOMErrorHandler *myErrorHandler = new DOMPrintErrorHandler();
            DOMConfiguration* serializerConfig=theSerializer->getDomConfig();
            serializerConfig->setParameter(XMLUni::fgDOMErrorHandler, myErrorHandler);

            // set feature if the serializer supports the feature/mode
            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections))
                serializerConfig->setParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent))
                serializerConfig->setParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint))
                serializerConfig->setParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTBOM, gWriteBOM))
                serializerConfig->setParameter(XMLUni::fgDOMWRTBOM, gWriteBOM);
            
            if (serializerConfig->canSetParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration))
                serializerConfig->setParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration);

            //
            // Plug in a format target to receive the resultant
            // XML stream from the serializer.
            //
            // StdOutFormatTarget prints the resultant XML stream
            // to stdout once it receives any thing from the serializer.
            //
            XMLFormatTarget *myFormTarget;
            if (goutputfile)
                myFormTarget=new LocalFileFormatTarget(goutputfile);
            else
                myFormTarget=new StdOutFormatTarget();
            theOutputDesc->setByteStream(myFormTarget);

            // get the DOM representation
            DOMDocument *doc = parser->getDocument();

            //
            // do the serialization through DOMLSSerializer::write();
            //
            if(gXPathExpression!=NULL)
            {
                XMLCh* xpathStr=XMLString::transcode(gXPathExpression);
                DOMElement* root = doc->getDocumentElement();
                try
                {
                    DOMXPathNSResolver* resolver=doc->createNSResolver(root);
                    DOMXPathResult* result=doc->evaluate(
                      xpathStr,
                      root,
                      resolver,
                      DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE,
                      NULL);

                    XMLSize_t nLength = result->getSnapshotLength();
                    for(XMLSize_t i = 0; i < nLength; i++)
                    {
                      result->snapshotItem(i);
                      theSerializer->write(result->getNodeValue(), theOutputDesc);
                    }

                    result->release();
                    resolver->release ();
                }
                catch(const DOMXPathException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                catch(const DOMException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                XMLString::release(&xpathStr);
            }
            else
                theSerializer->write(doc, theOutputDesc);

            theOutputDesc->release();
            theSerializer->release();

            //
            // Filter, formatTarget and error handler
            // are NOT owned by the serializer.
            //
            delete myFormTarget;
            delete myErrorHandler;

            if (gUseFilter)
                delete myFilter;

        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            retval = 5;
        }
        catch (const DOMLSException& e)
        {
            std::cerr << "An error occurred during serialization of the DOM tree. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "An error occurred during creation of output transcoder. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }

    }
    else
        retval = 4;

    //
    //  Clean up the error handler. The parser does not adopt handlers
    //  since they could be many objects or one object installed for multiple
    //  handlers.
    //
    delete errReporter;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLString::release(&gOutputEncoding);

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return retval;
}